

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O1

Sentence * __thiscall
jhu::thrax::split(Sentence *__return_storage_ptr__,thrax *this,string_view line)

{
  pointer *ppbVar1;
  iterator __position;
  int iVar2;
  thrax *ptVar3;
  size_t sVar4;
  thrax *ptVar5;
  long lVar6;
  size_type __n;
  thrax *ptVar7;
  thrax *ptVar8;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  sVar4 = line._M_len;
  if (this == (thrax *)0x0) {
    __n = 1;
  }
  else {
    ptVar7 = (thrax *)0x0;
    lVar6 = 0;
    do {
      iVar2 = isspace((uint)(byte)ptVar7[sVar4]);
      lVar6 = (lVar6 + 1) - (ulong)(iVar2 == 0);
      ptVar7 = ptVar7 + 1;
    } while (this != ptVar7);
    __n = lVar6 + 1;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(__return_storage_ptr__,__n);
  ptVar7 = this + sVar4;
  if (split(std::basic_string_view<char,std::char_traits<char>>)::notSpace == '\0') {
    split();
  }
  ptVar3 = (thrax *)std::find_if<char_const*,std::_Not_fn<jhu::thrax::__0>>(sVar4,ptVar7);
  do {
    if (ptVar7 <= ptVar3) {
      return __return_storage_ptr__;
    }
    lVar6 = (long)ptVar7 - (long)ptVar3 >> 2;
    ptVar5 = ptVar3;
    if (0 < lVar6) {
      ptVar5 = ptVar3 + ((long)ptVar7 - (long)ptVar3 & 0xfffffffffffffffc);
      lVar6 = lVar6 + 1;
      ptVar8 = ptVar3 + 3;
      do {
        iVar2 = isspace((uint)(byte)ptVar8[-3]);
        if (iVar2 != 0) {
          ptVar8 = ptVar8 + -3;
          goto LAB_00104d4b;
        }
        iVar2 = isspace((uint)(byte)ptVar8[-2]);
        if (iVar2 != 0) {
          ptVar8 = ptVar8 + -2;
          goto LAB_00104d4b;
        }
        iVar2 = isspace((uint)(byte)ptVar8[-1]);
        if (iVar2 != 0) {
          ptVar8 = ptVar8 + -1;
          goto LAB_00104d4b;
        }
        iVar2 = isspace((uint)(byte)*ptVar8);
        if (iVar2 != 0) goto LAB_00104d4b;
        lVar6 = lVar6 + -1;
        ptVar8 = ptVar8 + 4;
      } while (1 < lVar6);
    }
    lVar6 = (long)ptVar7 - (long)ptVar5;
    if (lVar6 == 1) {
LAB_00104d38:
      iVar2 = isspace((uint)(byte)*ptVar5);
      ptVar8 = ptVar5;
      if (iVar2 == 0) {
        ptVar8 = ptVar7;
      }
    }
    else if (lVar6 == 2) {
LAB_00104d12:
      iVar2 = isspace((uint)(byte)*ptVar5);
      ptVar8 = ptVar5;
      if (iVar2 == 0) {
        ptVar5 = ptVar5 + 1;
        goto LAB_00104d38;
      }
    }
    else {
      ptVar8 = ptVar7;
      if ((lVar6 == 3) && (iVar2 = isspace((uint)(byte)*ptVar5), ptVar8 = ptVar5, iVar2 == 0)) {
        ptVar5 = ptVar5 + 1;
        goto LAB_00104d12;
      }
    }
LAB_00104d4b:
    local_40._M_len = (long)ptVar8 - (long)ptVar3;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_40._M_str = (char *)ptVar3;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_M_realloc_insert<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)__return_storage_ptr__,__position,&local_40);
    }
    else {
      local_40._M_str._0_4_ = SUB84(ptVar3,0);
      local_40._M_str._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      (__position._M_current)->_M_len = local_40._M_len;
      *(undefined4 *)&(__position._M_current)->_M_str = local_40._M_str._0_4_;
      *(undefined4 *)((long)&(__position._M_current)->_M_str + 4) = local_40._M_str._4_4_;
      ppbVar1 = &(__return_storage_ptr__->
                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppbVar1 = *ppbVar1 + 1;
    }
    ptVar3 = (thrax *)std::find_if<char_const*,std::_Not_fn<jhu::thrax::__0>>(ptVar8,ptVar7);
  } while( true );
}

Assistant:

inline Sentence split(std::string_view line) {
  auto spaces = std::count_if(line.begin(), line.end(), isSpace);
  Sentence result;
  result.reserve(spaces + 1);  // estimate
  static const auto notSpace = std::not_fn(isSpace);
  auto s = std::find_if(line.begin(), line.end(), notSpace);
  for (auto e = s; s < line.end(); s = std::find_if(e, line.end(), notSpace)) {
    e = std::find_if(s, line.end(), isSpace);
    size_t len = std::distance(s, e);
    result.push_back({ s, len });
  }
  return result;
}